

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::determine_shared_pbits
               (uint32_t total_comps,uint32_t comp_bits,float *xl,float *xh,
               color_quad_u8 *bestMinColor,color_quad_u8 *bestMaxColor,uint32_t *best_pbits)

{
  byte bVar1;
  int32_t iVar2;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  uint in_EDI;
  long in_R8;
  long in_R9;
  float fVar3;
  float fVar4;
  uint32_t j;
  uint32_t i_1;
  float err;
  uint32_t i;
  color_quad_u8 scaledHigh;
  color_quad_u8 scaledLow;
  uint32_t c;
  color_quad_u8 xMaxColor;
  color_quad_u8 xMinColor;
  int p;
  float best_err;
  float scalep;
  int iscalep;
  uint32_t total_bits;
  uint local_60;
  uint local_5c;
  float local_58;
  uint local_54;
  byte abStack_50 [4];
  byte abStack_4c [4];
  uint local_48;
  byte abStack_44 [4];
  byte abStack_40 [4];
  int local_3c;
  float local_38;
  float local_34;
  int local_30;
  uint local_2c;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  uint local_4;
  
  local_2c = in_ESI + 1;
  if (local_2c < 4 || 8 < local_2c) {
    __assert_fail("total_bits >= 4 && total_bits <= 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x31d8,
                  "void basist::determine_shared_pbits(uint32_t, uint32_t, float *, float *, color_quad_u8 &, color_quad_u8 &, uint32_t *)"
                 );
  }
  local_30 = (1 << ((byte)local_2c & 0x1f)) + -1;
  local_34 = (float)local_30;
  local_38 = 1e+09;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_4 = in_EDI;
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
      iVar2 = clampi((int)((*(float *)(local_10 + (ulong)local_48 * 4) * local_34 - (float)local_3c)
                           / 2.0 + 0.5) * 2 + local_3c,local_3c,local_30 + -1 + local_3c);
      abStack_40[local_48] = (byte)iVar2;
      iVar2 = clampi((int)((*(float *)(local_18 + (ulong)local_48 * 4) * local_34 - (float)local_3c)
                           / 2.0 + 0.5) * 2 + local_3c,local_3c,local_30 + -1 + local_3c);
      abStack_44[local_48] = (byte)iVar2;
    }
    for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
      bVar1 = (byte)local_2c;
      abStack_4c[local_54] = abStack_40[local_54] << (8 - bVar1 & 0x1f);
      abStack_4c[local_54] =
           abStack_4c[local_54] | (byte)((int)(uint)abStack_4c[local_54] >> (bVar1 & 0x1f));
      abStack_50[local_54] = abStack_44[local_54] << (8 - bVar1 & 0x1f);
      abStack_50[local_54] =
           abStack_50[local_54] | (byte)((int)(uint)abStack_50[local_54] >> (bVar1 & 0x1f));
    }
    local_58 = 0.0;
    for (local_5c = 0; local_5c < local_4; local_5c = local_5c + 1) {
      fVar3 = basisu::squaref((float)abStack_4c[local_5c] / 255.0 -
                              *(float *)(local_10 + (ulong)local_5c * 4));
      fVar4 = basisu::squaref((float)abStack_50[local_5c] / 255.0 -
                              *(float *)(local_18 + (ulong)local_5c * 4));
      local_58 = fVar3 + fVar4 + local_58;
    }
    if (local_58 < local_38) {
      local_38 = local_58;
      *_j = local_3c;
      _j[1] = local_3c;
      for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
        *(char *)(local_20 + (ulong)local_60) = (char)((int)(uint)abStack_40[local_60] >> 1);
        *(char *)(local_28 + (ulong)local_60) = (char)((int)(uint)abStack_44[local_60] >> 1);
      }
    }
  }
  return;
}

Assistant:

static void determine_shared_pbits(
		uint32_t total_comps, uint32_t comp_bits, float xl[4], float xh[4],
		color_quad_u8& bestMinColor, color_quad_u8& bestMaxColor, uint32_t best_pbits[2])
	{
		const uint32_t total_bits = comp_bits + 1;
		assert(total_bits >= 4 && total_bits <= 8);

		const int iscalep = (1 << total_bits) - 1;
		const float scalep = (float)iscalep;

		float best_err = 1e+9f;

		for (int p = 0; p < 2; p++)
		{
			color_quad_u8 xMinColor, xMaxColor;
			for (uint32_t c = 0; c < 4; c++)
			{
				xMinColor.m_c[c] = (uint8_t)(clampi(((int)((xl[c] * scalep - p) / 2.0f + .5f)) * 2 + p, p, iscalep - 1 + p));
				xMaxColor.m_c[c] = (uint8_t)(clampi(((int)((xh[c] * scalep - p) / 2.0f + .5f)) * 2 + p, p, iscalep - 1 + p));
			}

			color_quad_u8 scaledLow, scaledHigh;

			for (uint32_t i = 0; i < 4; i++)
			{
				scaledLow.m_c[i] = (xMinColor.m_c[i] << (8 - total_bits));
				scaledLow.m_c[i] |= (scaledLow.m_c[i] >> total_bits);
				assert(scaledLow.m_c[i] <= 255);

				scaledHigh.m_c[i] = (xMaxColor.m_c[i] << (8 - total_bits));
				scaledHigh.m_c[i] |= (scaledHigh.m_c[i] >> total_bits);
				assert(scaledHigh.m_c[i] <= 255);
			}

			float err = 0;
			for (uint32_t i = 0; i < total_comps; i++)
				err += basisu::squaref((scaledLow.m_c[i] / 255.0f) - xl[i]) + basisu::squaref((scaledHigh.m_c[i] / 255.0f) - xh[i]);

			if (err < best_err)
			{
				best_err = err;
				best_pbits[0] = p;
				best_pbits[1] = p;
				for (uint32_t j = 0; j < 4; j++)
				{
					bestMinColor.m_c[j] = xMinColor.m_c[j] >> 1;
					bestMaxColor.m_c[j] = xMaxColor.m_c[j] >> 1;
				}
			}
		}
	}